

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2latlng_rect.cc
# Opt level: O0

ostream * operator<<(ostream *os,S2LatLngRect *r)

{
  ostream *poVar1;
  R2Point local_38;
  R2Point local_28;
  S2LatLngRect *local_18;
  S2LatLngRect *r_local;
  ostream *os_local;
  
  local_18 = r;
  r_local = (S2LatLngRect *)os;
  poVar1 = std::operator<<(os,"[Lo");
  local_28.c_ = (VType  [2])S2LatLngRect::lo(local_18);
  poVar1 = operator<<(poVar1,(S2LatLng *)&local_28);
  poVar1 = std::operator<<(poVar1,", Hi");
  local_38.c_ = (VType  [2])S2LatLngRect::hi(local_18);
  poVar1 = operator<<(poVar1,(S2LatLng *)&local_38);
  poVar1 = std::operator<<(poVar1,"]");
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const S2LatLngRect& r) {
  return os << "[Lo" << r.lo() << ", Hi" << r.hi() << "]";
}